

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc-posix.c
# Opt level: O0

int mi_dupenv_s(char **buf,size_t *size,char *name)

{
  char *s;
  char *pcVar1;
  size_t sVar2;
  char *in_RDX;
  size_t *in_RSI;
  long *in_RDI;
  char *p;
  int local_4;
  
  if ((in_RDI == (long *)0x0) || (in_RDX == (char *)0x0)) {
    local_4 = 0x16;
  }
  else {
    if (in_RSI != (size_t *)0x0) {
      *in_RSI = 0;
    }
    s = getenv(in_RDX);
    if (s == (char *)0x0) {
      *in_RDI = 0;
    }
    else {
      pcVar1 = mi_strdup((char *)0xab7da0);
      *in_RDI = (long)pcVar1;
      if (*in_RDI == 0) {
        return 0xc;
      }
      if (in_RSI != (size_t *)0x0) {
        sVar2 = _mi_strlen(s);
        *in_RSI = sVar2;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mi_dupenv_s(char** buf, size_t* size, const char* name) mi_attr_noexcept {
  if (buf==NULL || name==NULL) return EINVAL;
  if (size != NULL) *size = 0;
  char* p = getenv(name);        // mscver warning 4996
  if (p==NULL) {
    *buf = NULL;
  }
  else {
    *buf = mi_strdup(p);
    if (*buf==NULL) return ENOMEM;
    if (size != NULL) *size = _mi_strlen(p);
  }
  return 0;
}